

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

Name __thiscall
wasm::Names::getValidName
          (Names *this,Name root,function<bool_(wasm::Name)> *check,Index hint,string *separator)

{
  Name __args;
  IString IVar1;
  bool bVar2;
  undefined4 in_register_00000084;
  string_view local_f8;
  string local_e8;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Index num;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefixed;
  string *separator_local;
  Index hint_local;
  function<bool_(wasm::Name)> *check_local;
  Name root_local;
  char *local_10;
  
  root_local.super_IString.str._M_len = root.super_IString.str._M_len;
  __args.super_IString.str._M_str = (char *)root_local.super_IString.str._M_len;
  __args.super_IString.str._M_len = (size_t)this;
  prefixed.field_2._8_8_ = this;
  check_local = (function<bool_(wasm::Name)> *)this;
  bVar2 = std::function<bool_(wasm::Name)>::operator()(root.super_IString.str._M_str,__args);
  if (bVar2) {
    root_local.super_IString.str._M_str = (char *)check_local;
    local_10 = (char *)root_local.super_IString.str._M_len;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&check_local,
               &local_91);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_register_00000084,hint));
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    name.field_2._8_4_ = (int)check;
    do {
      std::__cxx11::to_string(&local_e8,name.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      Name::Name((Name *)&local_f8,(string *)local_c8);
      bVar2 = std::function<bool_(wasm::Name)>::operator()
                        (root.super_IString.str._M_str,(Name)local_f8);
      if (bVar2) {
        Name::Name((Name *)&root_local.super_IString.str._M_str,(string *)local_c8);
      }
      else {
        name.field_2._8_4_ = name.field_2._8_4_ + 1;
      }
      std::__cxx11::string::~string((string *)local_c8);
    } while (!bVar2);
    std::__cxx11::string::~string((string *)local_70);
  }
  IVar1.str._M_str = local_10;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidName(Name root,
                         std::function<bool(Name)> check,
                         Index hint = 0,
                         std::string separator = "_") {
  if (check(root)) {
    return root;
  }
  auto prefixed = std::string(root.str) + separator;
  Index num = hint;
  while (1) {
    auto name = prefixed + std::to_string(num);
    if (check(name)) {
      return name;
    }
    num++;
  }
}